

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfWrite.c
# Opt level: O2

Cnf_Dat_t * Cnf_ManWriteCnf(Cnf_Man_t *p,Vec_Ptr_t *vMapped,int nOutputs)

{
  char cVar1;
  char *pcVar2;
  Vec_Ptr_t *pVVar3;
  int iVar4;
  void *pvVar5;
  Cnf_Dat_t *pCVar6;
  int **ppiVar7;
  int *piVar8;
  long lVar9;
  Vec_Int_t *p_00;
  uint *puVar10;
  int iVar11;
  long lVar12;
  uint *puVar13;
  Vec_Int_t *pVVar14;
  int iVar15;
  uint uVar16;
  char cVar17;
  ulong uVar18;
  int iVar19;
  long lVar20;
  int iVar21;
  Aig_Man_t *pAVar22;
  int pVars [32];
  
  iVar11 = p->pManAig->nObjs[3];
  iVar19 = iVar11 + nOutputs * 3 + 1;
  iVar11 = iVar11 + nOutputs + 1;
  iVar15 = 0;
  do {
    if (vMapped->nSize <= iVar15) {
      pCVar6 = (Cnf_Dat_t *)calloc(1,0x48);
      pAVar22 = p->pManAig;
      pCVar6->pMan = pAVar22;
      pCVar6->nLiterals = iVar19;
      pCVar6->nClauses = iVar11;
      lVar12 = (long)iVar11;
      ppiVar7 = (int **)malloc(lVar12 * 8 + 8);
      pCVar6->pClauses = ppiVar7;
      lVar20 = (long)iVar19;
      piVar8 = (int *)malloc(lVar20 * 4);
      *ppiVar7 = piVar8;
      ppiVar7[lVar12] = piVar8 + lVar20;
      pVVar3 = pAVar22->vObjs;
      uVar18 = (ulong)pVVar3->nSize;
      piVar8 = (int *)malloc(uVar18 << 2);
      pCVar6->pVarNums = piVar8;
      for (lVar9 = 0; lVar9 < (int)uVar18; lVar9 = lVar9 + 1) {
        piVar8[lVar9] = -1;
        uVar18 = (ulong)(uint)pVVar3->nSize;
      }
      if (nOutputs == 0) {
        iVar11 = 1;
      }
      else if (pAVar22->nRegs == 0) {
        if (pAVar22->nObjs[3] != nOutputs) {
          __assert_fail("nOutputs == Aig_ManCoNum(p->pManAig)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfWrite.c"
                        ,0x10e,"Cnf_Dat_t *Cnf_ManWriteCnf(Cnf_Man_t *, Vec_Ptr_t *, int)");
        }
        iVar19 = 0;
        while( true ) {
          iVar11 = iVar19 + 1;
          if (pAVar22->vCos->nSize <= iVar19) break;
          pvVar5 = Vec_PtrEntry(pAVar22->vCos,iVar19);
          piVar8[*(int *)((long)pvVar5 + 0x24)] = iVar11;
          pAVar22 = p->pManAig;
          iVar19 = iVar11;
        }
      }
      else {
        if (pAVar22->nRegs != nOutputs) {
          __assert_fail("nOutputs == Aig_ManRegNum(p->pManAig)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfWrite.c"
                        ,0x114,"Cnf_Dat_t *Cnf_ManWriteCnf(Cnf_Man_t *, Vec_Ptr_t *, int)");
        }
        iVar11 = 1;
        for (iVar19 = pAVar22->nObjs[3] - nOutputs; iVar19 < pAVar22->vCos->nSize;
            iVar19 = iVar19 + 1) {
          pvVar5 = Vec_PtrEntry(pAVar22->vCos,iVar19);
          piVar8[*(int *)((long)pvVar5 + 0x24)] = iVar11;
          iVar11 = iVar11 + 1;
          pAVar22 = p->pManAig;
        }
      }
      for (iVar19 = 0; iVar15 = iVar11 + iVar19, iVar19 < vMapped->nSize; iVar19 = iVar19 + 1) {
        pvVar5 = Vec_PtrEntry(vMapped,iVar19);
        piVar8[*(int *)((long)pvVar5 + 0x24)] = iVar15;
      }
      iVar11 = 0;
      while( true ) {
        pVVar3 = p->pManAig->vCis;
        if (pVVar3->nSize <= iVar11) break;
        pvVar5 = Vec_PtrEntry(pVVar3,iVar11);
        piVar8[*(int *)((long)pvVar5 + 0x24)] = iVar15 + iVar11;
        iVar11 = iVar11 + 1;
      }
      piVar8[p->pManAig->pConst1->Id] = iVar15 + iVar11;
      pCVar6->nVars = iVar11 + iVar15 + 1;
      p_00 = Vec_IntAlloc(0x10000);
      puVar13 = (uint *)*ppiVar7;
      for (iVar11 = 0; iVar11 < vMapped->nSize; iVar11 = iVar11 + 1) {
        pvVar5 = Vec_PtrEntry(vMapped,iVar11);
        pcVar2 = *(char **)((long)pvVar5 + 0x28);
        piVar8 = pCVar6->pVarNums;
        iVar19 = piVar8[*(int *)((long)pvVar5 + 0x24)];
        cVar17 = *pcVar2;
        iVar15 = 0;
        if ('\0' < cVar17) {
          iVar15 = (int)cVar17;
        }
        lVar9 = 0;
        while (iVar15 != lVar9) {
          iVar4 = piVar8[*(int *)(pcVar2 + lVar9 * 4 + 0x18)];
          pVars[lVar9] = iVar4;
          lVar9 = lVar9 + 1;
          if (p->pManAig->vObjs->nSize < iVar4) {
            __assert_fail("pVars[k] <= Aig_ManObjNumMax(p->pManAig)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfWrite.c"
                          ,0x14d,"Cnf_Dat_t *Cnf_ManWriteCnf(Cnf_Man_t *, Vec_Ptr_t *, int)");
          }
        }
        if (cVar17 < '\x05') {
          Cnf_SopConvertToVector
                    (p->pSops[*(ushort *)(pcVar2 + (long)cVar17 * 4 + 0x18)],
                     (int)p->pSopSizes[*(ushort *)(pcVar2 + (long)cVar17 * 4 + 0x18)],p_00);
          pVVar14 = p_00;
        }
        else {
          pVVar14 = *(Vec_Int_t **)(pcVar2 + 0x10);
        }
        uVar16 = iVar19 * 2;
        for (iVar19 = 0; iVar19 < pVVar14->nSize; iVar19 = iVar19 + 1) {
          iVar15 = Vec_IntEntry(pVVar14,iVar19);
          *ppiVar7 = (int *)puVar13;
          ppiVar7 = ppiVar7 + 1;
          *puVar13 = uVar16;
          iVar15 = Cnf_IsopWriteCube(iVar15,(int)*pcVar2,pVars,(int *)(puVar13 + 1));
          puVar13 = puVar13 + (long)iVar15 + 1;
        }
        if ((long)*pcVar2 < 5) {
          Cnf_SopConvertToVector
                    (p->pSops[*(ushort *)(pcVar2 + (long)*pcVar2 * 4 + 0x18) ^ 0xffff],
                     (int)p->pSopSizes[*(ushort *)(pcVar2 + (long)*pcVar2 * 4 + 0x18) ^ 0xffff],p_00
                    );
          pVVar14 = p_00;
        }
        else {
          pVVar14 = *(Vec_Int_t **)(pcVar2 + 8);
        }
        for (iVar19 = 0; iVar19 < pVVar14->nSize; iVar19 = iVar19 + 1) {
          iVar15 = Vec_IntEntry(pVVar14,iVar19);
          *ppiVar7 = (int *)puVar13;
          ppiVar7 = ppiVar7 + 1;
          *puVar13 = uVar16 | 1;
          iVar15 = Cnf_IsopWriteCube(iVar15,(int)*pcVar2,pVars,(int *)(puVar13 + 1));
          puVar13 = puVar13 + (long)iVar15 + 1;
        }
      }
      Vec_IntFree(p_00);
      iVar11 = pCVar6->pVarNums[p->pManAig->pConst1->Id];
      if (p->pManAig->vObjs->nSize < iVar11) {
        __assert_fail("OutVar <= Aig_ManObjNumMax(p->pManAig)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfWrite.c"
                      ,0x174,"Cnf_Dat_t *Cnf_ManWriteCnf(Cnf_Man_t *, Vec_Ptr_t *, int)");
      }
      *ppiVar7 = (int *)puVar13;
      ppiVar7 = ppiVar7 + 1;
      *puVar13 = iVar11 * 2;
      puVar13 = puVar13 + 1;
      for (iVar11 = 0; pVVar3 = p->pManAig->vCos, iVar11 < pVVar3->nSize; iVar11 = iVar11 + 1) {
        pvVar5 = Vec_PtrEntry(pVVar3,iVar11);
        iVar19 = pCVar6->pVarNums
                 [*(int *)((*(ulong *)((long)pvVar5 + 8) & 0xfffffffffffffffe) + 0x24)];
        if (iVar11 < p->pManAig->nObjs[3] - nOutputs) {
          puVar10 = puVar13 + 1;
          *ppiVar7 = (int *)puVar13;
          ppiVar7 = ppiVar7 + 1;
          uVar16 = (*(uint *)((long)pvVar5 + 8) & 1) + iVar19 * 2;
        }
        else {
          iVar15 = pCVar6->pVarNums[*(int *)((long)pvVar5 + 0x24)];
          *ppiVar7 = (int *)puVar13;
          puVar13[1] = (*(uint *)((long)pvVar5 + 8) & 1) + iVar19 * 2 ^ 1;
          ppiVar7[1] = (int *)(puVar13 + 2);
          ppiVar7 = ppiVar7 + 2;
          uVar16 = iVar15 * 2;
          puVar13[2] = iVar15 * 2 + 1;
          puVar10 = puVar13 + 4;
          puVar13[3] = (*(uint *)((long)pvVar5 + 8) & 1) + iVar19 * 2;
        }
        *puVar13 = uVar16;
        puVar13 = puVar10;
      }
      if ((long)puVar13 - (long)*pCVar6->pClauses >> 2 != lVar20) {
        __assert_fail("pLits - pCnf->pClauses[0] == nLiterals",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfWrite.c"
                      ,400,"Cnf_Dat_t *Cnf_ManWriteCnf(Cnf_Man_t *, Vec_Ptr_t *, int)");
      }
      if ((long)ppiVar7 - (long)pCVar6->pClauses >> 3 != lVar12) {
        __assert_fail("pClas - pCnf->pClauses == nClauses",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfWrite.c"
                      ,0x191,"Cnf_Dat_t *Cnf_ManWriteCnf(Cnf_Man_t *, Vec_Ptr_t *, int)");
      }
      return pCVar6;
    }
    pvVar5 = Vec_PtrEntry(vMapped,iVar15);
    if ((*(uint *)((long)pvVar5 + 0x18) & 7) - 7 < 0xfffffffe) {
      __assert_fail("Aig_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfWrite.c"
                    ,0xd7,"Cnf_Dat_t *Cnf_ManWriteCnf(Cnf_Man_t *, Vec_Ptr_t *, int)");
    }
    pcVar2 = *(char **)((long)pvVar5 + 0x28);
    cVar17 = *pcVar2;
    if ((long)cVar17 < 5) {
      cVar1 = p->pSopSizes[*(ushort *)(pcVar2 + (long)cVar17 * 4 + 0x18)];
      iVar21 = (int)cVar1;
      iVar4 = Cnf_SopCountLiterals(p->pSops[*(ushort *)(pcVar2 + (long)cVar17 * 4 + 0x18)],iVar21);
      if (cVar1 < '\0') {
        __assert_fail("p->pSopSizes[uTruth] >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfWrite.c"
                      ,0xdf,"Cnf_Dat_t *Cnf_ManWriteCnf(Cnf_Man_t *, Vec_Ptr_t *, int)");
      }
      iVar11 = iVar11 + iVar21;
      iVar19 = iVar4 + iVar21 + iVar19;
LAB_0046ea00:
      cVar1 = p->pSopSizes[*(ushort *)(pcVar2 + (long)cVar17 * 4 + 0x18) ^ 0xffff];
      iVar4 = (int)cVar1;
      iVar21 = Cnf_SopCountLiterals
                         (p->pSops[*(ushort *)(pcVar2 + (long)cVar17 * 4 + 0x18) ^ 0xffff],iVar4);
      if (cVar1 < '\0') {
        __assert_fail("p->pSopSizes[uTruth] >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfWrite.c"
                      ,0xec,"Cnf_Dat_t *Cnf_ManWriteCnf(Cnf_Man_t *, Vec_Ptr_t *, int)");
      }
    }
    else {
      iVar4 = Cnf_IsopCountLiterals(*(Vec_Int_t **)(pcVar2 + 0x10),(int)cVar17);
      cVar17 = *pcVar2;
      iVar11 = iVar11 + *(int *)(*(long *)(pcVar2 + 0x10) + 4);
      iVar19 = iVar4 + iVar19 + *(int *)(*(long *)(pcVar2 + 0x10) + 4);
      if (cVar17 < 5) goto LAB_0046ea00;
      iVar21 = Cnf_IsopCountLiterals(*(Vec_Int_t **)(pcVar2 + 8),(int)cVar17);
      iVar4 = *(int *)(*(long *)(pcVar2 + 8) + 4);
    }
    iVar19 = iVar19 + iVar21 + iVar4;
    iVar11 = iVar11 + iVar4;
    iVar15 = iVar15 + 1;
  } while( true );
}

Assistant:

Cnf_Dat_t * Cnf_ManWriteCnf( Cnf_Man_t * p, Vec_Ptr_t * vMapped, int nOutputs )
{
    int fChangeVariableOrder = 0; // should be set to 0 to improve performance
    Aig_Obj_t * pObj;
    Cnf_Dat_t * pCnf;
    Cnf_Cut_t * pCut;
    Vec_Int_t * vCover, * vSopTemp;
    int OutVar, PoVar, pVars[32], * pLits, ** pClas;
    unsigned uTruth;
    int i, k, nLiterals, nClauses, Cube, Number;

    // count the number of literals and clauses
    nLiterals = 1 + Aig_ManCoNum( p->pManAig ) + 3 * nOutputs;
    nClauses = 1 + Aig_ManCoNum( p->pManAig ) + nOutputs;
    Vec_PtrForEachEntry( Aig_Obj_t *, vMapped, pObj, i )
    {
        assert( Aig_ObjIsNode(pObj) );
        pCut = Cnf_ObjBestCut( pObj );

        // positive polarity of the cut
        if ( pCut->nFanins < 5 )
        {
            uTruth = 0xFFFF & *Cnf_CutTruth(pCut);
            nLiterals += Cnf_SopCountLiterals( p->pSops[uTruth], p->pSopSizes[uTruth] ) + p->pSopSizes[uTruth];
            assert( p->pSopSizes[uTruth] >= 0 );
            nClauses += p->pSopSizes[uTruth];
        }
        else
        {
            nLiterals += Cnf_IsopCountLiterals( pCut->vIsop[1], pCut->nFanins ) + Vec_IntSize(pCut->vIsop[1]);
            nClauses += Vec_IntSize(pCut->vIsop[1]);
        }
        // negative polarity of the cut
        if ( pCut->nFanins < 5 )
        {
            uTruth = 0xFFFF & ~*Cnf_CutTruth(pCut);
            nLiterals += Cnf_SopCountLiterals( p->pSops[uTruth], p->pSopSizes[uTruth] ) + p->pSopSizes[uTruth];
            assert( p->pSopSizes[uTruth] >= 0 );
            nClauses += p->pSopSizes[uTruth];
        }
        else
        {
            nLiterals += Cnf_IsopCountLiterals( pCut->vIsop[0], pCut->nFanins ) + Vec_IntSize(pCut->vIsop[0]);
            nClauses += Vec_IntSize(pCut->vIsop[0]);
        }
//printf( "%d ", nClauses-(1 + Aig_ManCoNum( p->pManAig )) );
    }
//printf( "\n" );

    // allocate CNF
    pCnf = ABC_CALLOC( Cnf_Dat_t, 1 );
    pCnf->pMan = p->pManAig;
    pCnf->nLiterals = nLiterals;
    pCnf->nClauses = nClauses;
    pCnf->pClauses = ABC_ALLOC( int *, nClauses + 1 );
    pCnf->pClauses[0] = ABC_ALLOC( int, nLiterals );
    pCnf->pClauses[nClauses] = pCnf->pClauses[0] + nLiterals;
    // create room for variable numbers
    pCnf->pVarNums = ABC_ALLOC( int, Aig_ManObjNumMax(p->pManAig) );
//    memset( pCnf->pVarNums, 0xff, sizeof(int) * Aig_ManObjNumMax(p->pManAig) );
    for ( i = 0; i < Aig_ManObjNumMax(p->pManAig); i++ )
        pCnf->pVarNums[i] = -1;

    if ( !fChangeVariableOrder )
    {
        // assign variables to the last (nOutputs) POs
        Number = 1;
        if ( nOutputs )
        {
            if ( Aig_ManRegNum(p->pManAig) == 0 )
            {
                assert( nOutputs == Aig_ManCoNum(p->pManAig) );
                Aig_ManForEachCo( p->pManAig, pObj, i )
                    pCnf->pVarNums[pObj->Id] = Number++;
            }
            else
            {
                assert( nOutputs == Aig_ManRegNum(p->pManAig) );
                Aig_ManForEachLiSeq( p->pManAig, pObj, i )
                    pCnf->pVarNums[pObj->Id] = Number++;
            }
        }
        // assign variables to the internal nodes
        Vec_PtrForEachEntry( Aig_Obj_t *, vMapped, pObj, i )
            pCnf->pVarNums[pObj->Id] = Number++;
        // assign variables to the PIs and constant node
        Aig_ManForEachCi( p->pManAig, pObj, i )
            pCnf->pVarNums[pObj->Id] = Number++;
        pCnf->pVarNums[Aig_ManConst1(p->pManAig)->Id] = Number++;
        pCnf->nVars = Number;
    }
    else
    {
        // assign variables to the last (nOutputs) POs
        Number = Aig_ManObjNumMax(p->pManAig) + 1;
        pCnf->nVars = Number + 1;
        if ( nOutputs )
        {
            if ( Aig_ManRegNum(p->pManAig) == 0 )
            {
                assert( nOutputs == Aig_ManCoNum(p->pManAig) );
                Aig_ManForEachCo( p->pManAig, pObj, i )
                    pCnf->pVarNums[pObj->Id] = Number--;
            }
            else
            {
                assert( nOutputs == Aig_ManRegNum(p->pManAig) );
                Aig_ManForEachLiSeq( p->pManAig, pObj, i )
                    pCnf->pVarNums[pObj->Id] = Number--;
            }
        }
        // assign variables to the internal nodes
        Vec_PtrForEachEntry( Aig_Obj_t *, vMapped, pObj, i )
            pCnf->pVarNums[pObj->Id] = Number--;
        // assign variables to the PIs and constant node
        Aig_ManForEachCi( p->pManAig, pObj, i )
            pCnf->pVarNums[pObj->Id] = Number--;
        pCnf->pVarNums[Aig_ManConst1(p->pManAig)->Id] = Number--;
        assert( Number >= 0 );
    }

    // assign the clauses
    vSopTemp = Vec_IntAlloc( 1 << 16 );
    pLits = pCnf->pClauses[0];
    pClas = pCnf->pClauses;
    Vec_PtrForEachEntry( Aig_Obj_t *, vMapped, pObj, i )
    {
        pCut = Cnf_ObjBestCut( pObj );

        // save variables of this cut
        OutVar = pCnf->pVarNums[ pObj->Id ];
        for ( k = 0; k < (int)pCut->nFanins; k++ )
        {
            pVars[k] = pCnf->pVarNums[ pCut->pFanins[k] ];
            assert( pVars[k] <= Aig_ManObjNumMax(p->pManAig) );
        }

        // positive polarity of the cut
        if ( pCut->nFanins < 5 )
        {
            uTruth = 0xFFFF & *Cnf_CutTruth(pCut);
            Cnf_SopConvertToVector( p->pSops[uTruth], p->pSopSizes[uTruth], vSopTemp );
            vCover = vSopTemp;
        }
        else
            vCover = pCut->vIsop[1];
        Vec_IntForEachEntry( vCover, Cube, k )
        {
            *pClas++ = pLits;
            *pLits++ = 2 * OutVar; 
            pLits += Cnf_IsopWriteCube( Cube, pCut->nFanins, pVars, pLits );
        }

        // negative polarity of the cut
        if ( pCut->nFanins < 5 )
        {
            uTruth = 0xFFFF & ~*Cnf_CutTruth(pCut);
            Cnf_SopConvertToVector( p->pSops[uTruth], p->pSopSizes[uTruth], vSopTemp );
            vCover = vSopTemp;
        }
        else
            vCover = pCut->vIsop[0];
        Vec_IntForEachEntry( vCover, Cube, k )
        {
            *pClas++ = pLits;
            *pLits++ = 2 * OutVar + 1; 
            pLits += Cnf_IsopWriteCube( Cube, pCut->nFanins, pVars, pLits );
        }
    }
    Vec_IntFree( vSopTemp );
 
    // write the constant literal
    OutVar = pCnf->pVarNums[ Aig_ManConst1(p->pManAig)->Id ];
    assert( OutVar <= Aig_ManObjNumMax(p->pManAig) );
    *pClas++ = pLits;
    *pLits++ = 2 * OutVar; 

    // write the output literals
    Aig_ManForEachCo( p->pManAig, pObj, i )
    {
        OutVar = pCnf->pVarNums[ Aig_ObjFanin0(pObj)->Id ];
        if ( i < Aig_ManCoNum(p->pManAig) - nOutputs )
        {
            *pClas++ = pLits;
            *pLits++ = 2 * OutVar + Aig_ObjFaninC0(pObj); 
        }
        else
        {
            PoVar = pCnf->pVarNums[ pObj->Id ];
            // first clause
            *pClas++ = pLits;
            *pLits++ = 2 * PoVar; 
            *pLits++ = 2 * OutVar + !Aig_ObjFaninC0(pObj); 
            // second clause
            *pClas++ = pLits;
            *pLits++ = 2 * PoVar + 1; 
            *pLits++ = 2 * OutVar + Aig_ObjFaninC0(pObj); 
        }
    }

    // verify that the correct number of literals and clauses was written
    assert( pLits - pCnf->pClauses[0] == nLiterals );
    assert( pClas - pCnf->pClauses == nClauses );
//Cnf_DataPrint( pCnf, 1 );
    return pCnf;
}